

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network.c
# Opt level: O3

int cmpforsearch(void *av,void *bv)

{
  uint uVar1;
  
  uVar1 = 0xffffffff;
  if (*(int *)((long)bv + 8) <= *av) {
    uVar1 = (uint)(*(int *)((long)bv + 8) < *av);
  }
  return uVar1;
}

Assistant:

static int cmpforsearch(void *av, void *bv)
{
    NetSocket *b = (NetSocket *) bv;
    int as = *(int *)av, bs = b->s;
    if (as < bs)
        return -1;
    if (as > bs)
        return +1;
    return 0;
}